

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O1

Vec4 __thiscall glcts::SetLumSat(glcts *this,Vec4 *cbase,Vec4 *csat,Vec4 *clum)

{
  float fVar1;
  float fVar2;
  int i;
  long lVar3;
  uint uVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  Vec4 VVar10;
  Vector<float,_4> res;
  Vector<float,_4> res_1;
  Vector<float,_4> res_2;
  Vec4 local_58;
  float local_48 [16];
  
  fVar8 = cbase->m_data[0];
  fVar1 = cbase->m_data[1];
  fVar6 = (float)(~-(uint)(fVar8 <= fVar1) & (uint)fVar1 | -(uint)(fVar8 <= fVar1) & (uint)fVar8);
  fVar2 = cbase->m_data[2];
  uVar4 = -(uint)(fVar6 <= fVar2);
  fVar7 = (float)(~uVar4 & (uint)fVar2 | uVar4 & (uint)fVar6);
  fVar8 = (float)(~-(uint)(fVar1 <= fVar8) & (uint)fVar1 | (uint)fVar8 & -(uint)(fVar1 <= fVar8));
  uVar4 = -(uint)(fVar2 <= fVar8);
  fVar6 = (float)(~uVar4 & (uint)fVar2 | uVar4 & (uint)fVar8) - fVar7;
  fVar8 = csat->m_data[0];
  fVar1 = csat->m_data[1];
  fVar2 = csat->m_data[2];
  if (fVar6 <= 0.0) {
    local_58.m_data[0] = 0.0;
    local_58.m_data[1] = 0.0;
    local_58.m_data[2] = 0.0;
    local_58.m_data[3] = 0.0;
  }
  else {
    fVar9 = (float)(~-(uint)(fVar1 <= fVar8) & (uint)fVar1 | -(uint)(fVar1 <= fVar8) & (uint)fVar8);
    uVar4 = -(uint)(fVar2 <= fVar9);
    fVar8 = (float)(~-(uint)(fVar8 <= fVar1) & (uint)fVar1 | (uint)fVar8 & -(uint)(fVar8 <= fVar1));
    uVar5 = -(uint)(fVar8 <= fVar2);
    lVar3 = 0;
    do {
      local_48[lVar3 + 0xc] = fVar7;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    local_48[0] = 0.0;
    local_48[1] = 0.0;
    local_48[2] = 0.0;
    local_48[3] = 0.0;
    lVar3 = 0;
    do {
      local_48[lVar3] = cbase->m_data[lVar3] - local_48[lVar3 + 0xc];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    local_48[4] = 0.0;
    local_48[5] = 0.0;
    local_48[6] = 0.0;
    local_48[7] = 0.0;
    lVar3 = 0;
    do {
      local_48[lVar3 + 4] =
           local_48[lVar3] *
           ((float)(~uVar4 & (uint)fVar2 | uVar4 & (uint)fVar9) -
           (float)(~uVar5 & (uint)fVar2 | uVar5 & (uint)fVar8));
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    local_48[8] = 0.0;
    local_48[9] = 0.0;
    local_48[10] = 0.0;
    local_48[0xb] = 0.0;
    lVar3 = 0;
    do {
      local_48[lVar3 + 8] = local_48[lVar3 + 4] / fVar6;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    local_58.m_data[0] = local_48[8];
    local_58.m_data[1] = local_48[9];
    local_58.m_data[2] = local_48[10];
    local_58.m_data[3] = local_48[0xb];
  }
  VVar10 = SetLum(&local_58,clum);
  return (Vec4)VVar10.m_data;
}

Assistant:

static tcu::Vec4 SetLumSat(const tcu::Vec4& cbase, const tcu::Vec4& csat, const tcu::Vec4& clum)
{
	float	 minbase = MinRGB(cbase);
	float	 sbase   = Saturation(cbase);
	float	 ssat	= Saturation(csat);
	tcu::Vec4 color;
	if (sbase > 0)
	{
		// From the extension spec:
		// Equivalent (modulo rounding errors) to setting the
		// smallest (R,G,B) component to 0, the largest to <ssat>,
		// and interpolating the "middle" component based on its
		// original value relative to the smallest/largest.
		color = (cbase - tcu::Vec4(minbase)) * ssat / sbase;
	}
	else
	{
		color = tcu::Vec4(0.0f);
	}
	return SetLum(color, clum);
}